

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

PMTStreamInfo * streamByIndex(int index,PIDListMap *pidList)

{
  _Rb_tree_node_base *p_Var1;
  
  p_Var1 = (pidList->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(pidList->_M_t)._M_impl.super__Rb_tree_header) {
      return (PMTStreamInfo *)0x0;
    }
    if (*(int *)&p_Var1[6]._M_right[1]._M_left == index) break;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return (PMTStreamInfo *)&p_Var1[1]._M_parent;
}

Assistant:

const PMTStreamInfo* streamByIndex(const int index, const PIDListMap& pidList)
{
    for (const auto& [pid, si] : pidList)
    {
        const PMTStreamInfo& stream = si;
        if (stream.m_codecReader->getStreamIndex() == index)
            return &stream;
    }
    return nullptr;
}